

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zetMetricProgrammableGetParamInfoExp
          (zet_metric_programmable_exp_handle_t hMetricProgrammable,uint32_t *pParameterCount,
          zet_metric_programmable_param_info_exp_t *pParameterInfo)

{
  ze_result_t zVar1;
  
  if (DAT_0010e740 != (code *)0x0) {
    zVar1 = (*DAT_0010e740)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricProgrammableGetParamInfoExp(
        zet_metric_programmable_exp_handle_t hMetricProgrammable,   ///< [in] handle of the metric programmable
        uint32_t* pParameterCount,                      ///< [in,out] count of the parameters to retrieve parameter info.
                                                        ///< if value pParameterCount is greater than count of parameters
                                                        ///< available, then pParameterCount will be updated with count of
                                                        ///< parameters available.
                                                        ///< The count of parameters available can be queried using ::zetMetricProgrammableGetPropertiesExp.
        zet_metric_programmable_param_info_exp_t* pParameterInfo///< [in,out][range(1, *pParameterCount)] array of parameter info.
                                                        ///< if parameterCount is less than the number of parameters available,
                                                        ///< then driver shall only retrieve that number of parameter info.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetParamInfoExp = context.zetDdiTable.MetricProgrammableExp.pfnGetParamInfoExp;
        if( nullptr != pfnGetParamInfoExp )
        {
            result = pfnGetParamInfoExp( hMetricProgrammable, pParameterCount, pParameterInfo );
        }
        else
        {
            // generic implementation
        }

        return result;
    }